

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_imply_from(REF_DBL *metric,REF_GRID ref_grid)

{
  double dVar1;
  double dVar2;
  REF_NODE ref_node;
  REF_CELL pRVar3;
  REF_STATUS RVar4;
  uint uVar5;
  REF_DBL *total_node_volume;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  REF_INT RVar11;
  int iVar12;
  long lVar13;
  undefined8 *puVar14;
  REF_DBL *pRVar15;
  double dVar16;
  double dVar17;
  double local_180;
  REF_INT nodes [27];
  REF_DBL log_m [6];
  REF_DBL m [6];
  REF_DBL log_m_1 [6];
  
  ref_node = ref_grid->node;
  iVar12 = ref_node->max;
  lVar13 = (long)iVar12;
  if (lVar13 < 0) {
    pcVar10 = "malloc total_node_volume of REF_DBL negative";
    uVar7 = 0x634;
LAB_001ce53f:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar7,
           "ref_metric_imply_from",pcVar10);
    uVar5 = 1;
  }
  else {
    total_node_volume = (REF_DBL *)malloc(lVar13 * 8);
    if (total_node_volume == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x634,"ref_metric_imply_from","malloc total_node_volume of REF_DBL NULL");
      uVar5 = 2;
    }
    else {
      if (iVar12 != 0) {
        memset(total_node_volume,0,lVar13 * 8);
        memset(metric,0,lVar13 * 0x30);
      }
      if ((ref_grid->twod != 0) && (pRVar3 = ref_grid->cell[3], 0 < pRVar3->max)) {
        RVar11 = 0;
        do {
          RVar4 = ref_cell_nodes(pRVar3,RVar11,nodes);
          if (RVar4 == 0) {
            m[0]._0_4_ = nodes[0];
            m[0]._4_4_ = nodes[1];
            m[1]._0_4_ = nodes[2];
            pRVar15 = ref_node->real;
            RVar4 = ref_matrix_imply_m3(log_m,pRVar15 + (long)nodes[0] * 0xf,
                                        pRVar15 + (long)nodes[1] * 0xf,
                                        pRVar15 + (long)nodes[2] * 0xf);
            if (RVar4 == 0) {
              uVar5 = ref_matrix_log_m(log_m,log_m_1);
              if (uVar5 == 0) {
                uVar5 = ref_node_tri_area(ref_node,(REF_INT *)m,&local_180);
                if (uVar5 == 0) {
                  iVar12 = pRVar3->node_per;
                  if (0 < (long)iVar12) {
                    lVar13 = 0;
                    do {
                      lVar6 = (long)nodes[lVar13];
                      total_node_volume[lVar6] = total_node_volume[lVar6] + local_180;
                      lVar8 = 0;
                      do {
                        dVar1 = (metric + lVar6 * 6 + lVar8)[1];
                        dVar16 = log_m_1[lVar8 + 1];
                        metric[lVar6 * 6 + lVar8] =
                             log_m_1[lVar8] * local_180 + metric[lVar6 * 6 + lVar8];
                        (metric + lVar6 * 6 + lVar8)[1] = dVar16 * local_180 + dVar1;
                        lVar8 = lVar8 + 2;
                      } while (lVar8 != 6);
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != iVar12);
                  }
                  goto LAB_001cdfa4;
                }
                pcVar10 = "area";
                uVar7 = 0x61e;
              }
              else {
                pcVar10 = "log";
                uVar7 = 0x61d;
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,uVar7,"add_sub_tri",(ulong)uVar5,pcVar10);
              pcVar10 = "tet sub tet";
              uVar7 = 0x63e;
              goto LAB_001ce804;
            }
          }
LAB_001cdfa4:
          RVar11 = RVar11 + 1;
        } while (RVar11 < pRVar3->max);
      }
      pRVar3 = ref_grid->cell[8];
      if (0 < pRVar3->max) {
        RVar11 = 0;
        do {
          RVar4 = ref_cell_nodes(pRVar3,RVar11,nodes);
          if (RVar4 == 0) {
            uVar5 = add_sub_tet(0,1,2,3,nodes,metric,total_node_volume,ref_node,pRVar3);
            if (uVar5 != 0) {
              pcVar10 = "tet sub tet";
              uVar7 = 0x646;
              goto LAB_001ce804;
            }
          }
          RVar11 = RVar11 + 1;
        } while (RVar11 < pRVar3->max);
      }
      pRVar3 = ref_grid->cell[10];
      if (0 < pRVar3->max) {
        RVar11 = 0;
        do {
          RVar4 = ref_cell_nodes(pRVar3,RVar11,nodes);
          if (RVar4 == 0) {
            uVar5 = add_sub_tet(0,4,5,3,nodes,metric,total_node_volume,ref_node,pRVar3);
            if (uVar5 != 0) {
              pcVar10 = "pri sub tet";
              uVar7 = 0x64d;
              goto LAB_001ce804;
            }
            uVar5 = add_sub_tet(0,1,5,4,nodes,metric,total_node_volume,ref_node,pRVar3);
            if (uVar5 != 0) {
              pcVar10 = "pri sub tet";
              uVar7 = 0x650;
              goto LAB_001ce804;
            }
            uVar5 = add_sub_tet(0,1,2,5,nodes,metric,total_node_volume,ref_node,pRVar3);
            if (uVar5 != 0) {
              pcVar10 = "pri sub tet";
              uVar7 = 0x653;
              goto LAB_001ce804;
            }
          }
          RVar11 = RVar11 + 1;
        } while (RVar11 < pRVar3->max);
      }
      pRVar3 = ref_grid->cell[9];
      if (0 < pRVar3->max) {
        iVar12 = 0;
        do {
          RVar4 = ref_cell_nodes(pRVar3,iVar12,nodes);
          if (RVar4 == 0) {
            uVar5 = add_sub_tet(0,4,1,2,nodes,metric,total_node_volume,ref_node,pRVar3);
            if (uVar5 != 0) {
              pcVar10 = "pyr sub tet";
              uVar7 = 0x65a;
              goto LAB_001ce804;
            }
            uVar5 = add_sub_tet(0,3,4,2,nodes,metric,total_node_volume,ref_node,pRVar3);
            if (uVar5 != 0) {
              pcVar10 = "pyr sub tet";
              uVar7 = 0x65d;
              goto LAB_001ce804;
            }
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 < pRVar3->max);
      }
      pRVar3 = ref_grid->cell[0xb];
      if (0 < pRVar3->max) {
        iVar12 = 0;
        do {
          RVar4 = ref_cell_nodes(pRVar3,iVar12,nodes);
          if (RVar4 == 0) {
            uVar5 = add_sub_tet(0,5,7,4,nodes,metric,total_node_volume,ref_node,pRVar3);
            if (uVar5 != 0) {
              pcVar10 = "hex sub tet";
              uVar7 = 0x664;
              goto LAB_001ce804;
            }
            uVar5 = add_sub_tet(0,1,7,5,nodes,metric,total_node_volume,ref_node,pRVar3);
            if (uVar5 != 0) {
              pcVar10 = "hex sub tet";
              uVar7 = 0x667;
              goto LAB_001ce804;
            }
            uVar5 = add_sub_tet(1,6,7,5,nodes,metric,total_node_volume,ref_node,pRVar3);
            if (uVar5 != 0) {
              pcVar10 = "hex sub tet";
              uVar7 = 0x66a;
              goto LAB_001ce804;
            }
            uVar5 = add_sub_tet(0,7,2,3,nodes,metric,total_node_volume,ref_node,pRVar3);
            if (uVar5 != 0) {
              pcVar10 = "hex sub tet";
              uVar7 = 0x66e;
              goto LAB_001ce804;
            }
            uVar5 = add_sub_tet(0,7,1,2,nodes,metric,total_node_volume,ref_node,pRVar3);
            if (uVar5 != 0) {
              pcVar10 = "hex sub tet";
              uVar7 = 0x671;
              goto LAB_001ce804;
            }
            uVar5 = add_sub_tet(1,7,6,2,nodes,metric,total_node_volume,ref_node,pRVar3);
            if (uVar5 != 0) {
              pcVar10 = "hex sub tet";
              uVar7 = 0x674;
              goto LAB_001ce804;
            }
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 < pRVar3->max);
      }
      iVar12 = ref_node->max;
      if (0 < iVar12) {
        lVar13 = 0;
        pRVar15 = metric;
        do {
          if ((-1 < ref_node->global[lVar13]) && (ref_node->ref_mpi->id == ref_node->part[lVar13]))
          {
            dVar1 = total_node_volume[lVar13];
            if (dVar1 <= 0.0) {
              pcVar10 = "zero metric contributions";
              uVar7 = 0x679;
              goto LAB_001ce53f;
            }
            puVar14 = (undefined8 *)((lVar13 * 0x30 & 0x7fffffff0U) + (long)metric);
            dVar16 = dVar1 * 1e+20;
            if (dVar16 <= -dVar16) {
              dVar16 = -dVar16;
            }
            lVar6 = 0;
            do {
              dVar2 = pRVar15[lVar6];
              dVar17 = dVar2;
              if (dVar2 <= -dVar2) {
                dVar17 = -dVar2;
              }
              if (dVar16 <= dVar17) {
                pcVar10 = "zero volume";
                uVar5 = 4;
                uVar7 = 0x67c;
                uVar9 = 4;
                goto LAB_001ce807;
              }
              log_m[lVar6] = dVar2 / dVar1;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 6);
            uVar5 = ref_matrix_exp_m(log_m,m);
            if (uVar5 != 0) {
              pcVar10 = "exp";
              uVar7 = 0x67f;
              goto LAB_001ce804;
            }
            puVar14[4] = m[4];
            puVar14[5] = m[5];
            puVar14[2] = m[2];
            puVar14[3] = m[3];
            *puVar14 = CONCAT44(m[0]._4_4_,m[0]._0_4_);
            puVar14[1] = CONCAT44(m[1]._4_4_,m[1]._0_4_);
            total_node_volume[lVar13] = 0.0;
            iVar12 = ref_node->max;
          }
          lVar13 = lVar13 + 1;
          pRVar15 = pRVar15 + 6;
        } while (lVar13 < iVar12);
      }
      free(total_node_volume);
      uVar5 = ref_node_ghost_dbl(ref_node,metric,6);
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        pcVar10 = "update ghosts";
        uVar7 = 0x687;
LAB_001ce804:
        uVar9 = (ulong)uVar5;
LAB_001ce807:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar7,"ref_metric_imply_from",uVar9,pcVar10);
      }
    }
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_metric_imply_from(REF_DBL *metric, REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL m[6], log_m[6];
  REF_DBL *total_node_volume;
  REF_INT node, im;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_malloc_init(total_node_volume, ref_node_max(ref_node), REF_DBL, 0.0);

  for (node = 0; node < ref_node_max(ref_node); node++)
    for (im = 0; im < 6; im++) metric[im + 6 * node] = 0.0;

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(add_sub_tri(0, 1, 2, nodes, metric, total_node_volume, ref_node,
                      ref_cell),
          "tet sub tet");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 1, 2, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "tet sub tet");
  }

  ref_cell = ref_grid_pri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 5, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 5, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 2, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
  }

  ref_cell = ref_grid_pyr(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
    RSS(add_sub_tet(0, 3, 4, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
  }

  ref_cell = ref_grid_hex(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 5, 7, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 1, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 6, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");

    RSS(add_sub_tet(0, 7, 2, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 7, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 7, 6, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RAS(0.0 < total_node_volume[node], "zero metric contributions");
      for (im = 0; im < 6; im++) {
        if (!ref_math_divisible(metric[im + 6 * node], total_node_volume[node]))
          RSS(REF_DIV_ZERO, "zero volume");
        log_m[im] = metric[im + 6 * node] / total_node_volume[node];
      }
      RSS(ref_matrix_exp_m(log_m, m), "exp");
      for (im = 0; im < 6; im++) metric[im + 6 * node] = m[im];
      total_node_volume[node] = 0.0;
    }
  }

  ref_free(total_node_volume);

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "update ghosts");

  return REF_SUCCESS;
}